

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O3

void __thiscall wallet::LegacyScriptPubKeyMan::SetHDSeed(LegacyScriptPubKeyMan *this,CPubKey *seed)

{
  WalletStorage *pWVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock40;
  unique_lock<std::recursive_mutex> local_78;
  undefined1 local_68 [16];
  uchar local_58 [8];
  undefined1 local_50 [16];
  uchar auStack_40 [8];
  uchar local_38 [8];
  int64_t local_30;
  int64_t iStack_28;
  int local_20;
  long local_18;
  long *plVar4;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_78._M_device =
       &(this->super_LegacyDataSPKM).super_FillableSigningProvider.cs_KeyStore.super_recursive_mutex
  ;
  local_78._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_78);
  local_30 = 0;
  iStack_28 = 0;
  local_50._0_4_ = 0;
  local_50._4_4_ = 0;
  pWVar1 = (this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage;
  uVar2 = (*pWVar1->_vptr_WalletStorage[6])(pWVar1,0x2227c);
  local_20 = (uVar2 & 0xff) + 1;
  CPubKey::GetID((CKeyID *)local_68,seed);
  local_38[0] = local_58[0];
  local_38[1] = local_58[1];
  local_38[2] = local_58[2];
  local_38[3] = local_58[3];
  local_50._8_8_ = local_68._0_8_;
  auStack_40[0] = local_68[8];
  auStack_40[1] = local_68[9];
  auStack_40[2] = local_68[10];
  auStack_40[3] = local_68[0xb];
  auStack_40[4] = local_68[0xc];
  auStack_40[5] = local_68[0xd];
  auStack_40[6] = local_68[0xe];
  auStack_40[7] = local_68[0xf];
  AddHDChain(this,(CHDChain *)local_50);
  boost::signals2::
  signal<void_(),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_()>,_boost::function<void_(const_boost::signals2::connection_&)>,_boost::signals2::mutex>
  ::operator()(&(this->super_LegacyDataSPKM).super_ScriptPubKeyMan.NotifyCanGetAddressesChanged);
  iVar3 = (*((this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage)->_vptr_WalletStorage[3])
                    ();
  plVar4 = (long *)CONCAT44(extraout_var,iVar3);
  (**(code **)(*plVar4 + 0x70))(local_68,plVar4,1);
  local_68._8_8_ = plVar4;
  (*((this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage)->_vptr_WalletStorage[5])();
  if ((long *)local_68._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_68._0_8_ + 0x28))();
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void LegacyScriptPubKeyMan::SetHDSeed(const CPubKey& seed)
{
    LOCK(cs_KeyStore);
    // store the keyid (hash160) together with
    // the child index counter in the database
    // as a hdchain object
    CHDChain newHdChain;
    newHdChain.nVersion = m_storage.CanSupportFeature(FEATURE_HD_SPLIT) ? CHDChain::VERSION_HD_CHAIN_SPLIT : CHDChain::VERSION_HD_BASE;
    newHdChain.seed_id = seed.GetID();
    AddHDChain(newHdChain);
    NotifyCanGetAddressesChanged();
    WalletBatch batch(m_storage.GetDatabase());
    m_storage.UnsetBlankWalletFlag(batch);
}